

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_wb97.c
# Opt level: O0

void func_exc_unpol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                   xc_mgga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  double *in_RCX;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tzk0;
  double t317;
  double t316;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t305;
  double t303;
  double t302;
  double t301;
  double t300;
  double t299;
  double t297;
  double t296;
  double t295;
  double t294;
  double t293;
  double t292;
  double t291;
  double t289;
  double t287;
  double t286;
  double t285;
  double t284;
  double t282;
  double t280;
  double t275;
  double t274;
  double t271;
  double t266;
  double t264;
  double t261;
  double t258;
  double t257;
  double t254;
  double t252;
  double t249;
  double t246;
  double t245;
  double t243;
  double t241;
  double t239;
  double t234;
  double t233;
  double t232;
  double t231;
  double t230;
  double t229;
  double t226;
  double t225;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t218;
  double t217;
  double t216;
  double t215;
  double t214;
  double t213;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t205;
  double t204;
  double t200;
  double t199;
  double t197;
  double t196;
  double t195;
  double t186;
  double t185;
  double t184;
  double t181;
  double t176;
  double t172;
  double t171;
  double t168;
  double t163;
  double t161;
  double t160;
  double t156;
  double t154;
  double t152;
  double t151;
  double t148;
  double t146;
  double t144;
  double t142;
  double t141;
  double t140;
  double t139;
  double t137;
  double t134;
  double t133;
  double t131;
  double t129;
  double t126;
  double t125;
  double t124;
  double t123;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t109;
  double t108;
  double t107;
  double t106;
  double t105;
  double t104;
  double t103;
  double t102;
  double t101;
  double t97;
  double t96;
  double t94;
  double t93;
  double t92;
  double t91;
  double t89;
  double t88;
  double t87;
  double t86;
  double t85;
  double t83;
  double t79;
  double t76;
  double t73;
  double t72;
  double t70;
  double t69;
  double t67;
  double t65;
  double t64;
  double t63;
  double t60;
  double t59;
  double t57;
  double t54;
  double t51;
  double t48;
  double t47;
  double t45;
  double t44;
  double t42;
  double t41;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t31;
  double t29;
  double t27;
  double t26;
  double t24;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t17;
  double t16;
  double t15;
  double t14;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double local_678;
  double local_668;
  double local_660;
  double local_650;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  bool local_609;
  
  pdVar1 = (double *)in_RDI[0x2f];
  dVar4 = (double)(1.0 <= (double)in_RDI[0x31]);
  local_609 = *in_RDX / 2.0 <= (double)in_RDI[0x30] || dVar4 != 0.0;
  dVar5 = (double)local_609;
  dVar6 = cbrt(0.3183098861837907);
  dVar7 = dVar6 * 1.4422495703074083;
  dVar8 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_650 = cbrt((double)in_RDI[0x31]);
  local_678 = local_650 * (double)in_RDI[0x31];
  local_618 = local_678;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_618 = 2.5198420997897464;
  }
  dVar9 = cbrt(*in_RDX);
  dVar10 = cbrt(9.0);
  dVar11 = 1.0 / dVar9;
  local_620 = local_650;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_620 = 1.2599210498948732;
  }
  local_630 = (dVar10 * dVar10 * dVar6 * dVar6 * (double)in_RDI[4] * 1.4422495703074083 * dVar11 *
              (1.2599210498948732 / local_620)) / 18.0;
  bVar2 = 1.35 <= local_630;
  dVar8 = (double)(1.35 < local_630);
  local_628 = local_630;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_628 = 1.35;
  }
  local_628 = local_628 * local_628;
  dVar10 = local_628 * local_628;
  dVar12 = dVar10 * dVar10;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_630 = 1.35;
  }
  dVar8 = sqrt(3.141592653589793);
  dVar13 = erf((1.0 / local_630) / 2.0);
  dVar14 = exp(-(1.0 / (local_630 * local_630)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_638 = (((((((1.0 / local_628) / 36.0 - (1.0 / dVar10) / 960.0) +
                    (1.0 / (dVar10 * local_628)) / 26880.0) - (1.0 / dVar12) / 829440.0) +
                  ((1.0 / dVar12) / local_628) / 28385280.0) -
                 ((1.0 / dVar12) / dVar10) / 1073479680.0) +
                ((1.0 / dVar12) / (dVar10 * local_628)) / 44590694400.0) -
                (1.0 / (dVar12 * dVar12)) / 2021444812800.0;
  }
  else {
    local_638 = -(local_630 * 2.6666666666666665) *
                (local_630 * 2.0 *
                 (-(local_630 * local_630 * 2.0) * (dVar14 - 1.0) + (dVar14 - 1.5)) + dVar8 * dVar13
                ) + 1.0;
  }
  dVar8 = pdVar1[1];
  dVar10 = *in_RCX;
  dVar13 = *in_RDX * *in_RDX;
  dVar14 = dVar9 * dVar9;
  dVar15 = (1.0 / dVar14) / dVar13;
  dVar16 = dVar15 * 1.5874010519681996;
  dVar15 = *in_RCX * 1.5874010519681996 * dVar15;
  dVar12 = pdVar1[2];
  dVar17 = cbrt(9.869604401089358);
  dVar17 = dVar17 * dVar17 * 3.3019272488946267;
  dVar18 = dVar17 * 0.3;
  dVar19 = *in_R9 * 1.5874010519681996 * ((1.0 / dVar14) / *in_RDX);
  dVar20 = dVar18 - dVar19;
  dVar18 = dVar18 + dVar19;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_640 = 0.0;
  }
  else {
    local_640 = dVar7 * 2.519842099789747 * 1.2599210498948732 * -0.046875 * local_618 * dVar9 *
                local_638 *
                (dVar12 * dVar20 * (1.0 / dVar18) +
                dVar8 * dVar10 * 0.003840616724010807 * dVar16 *
                (1.0 / (dVar15 * 0.003840616724010807 + 1.0)) + *pdVar1);
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_648 = (double)in_RDI[0x31];
  }
  else {
    local_648 = 1.0;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_650 = 1.0 / local_650;
  }
  else {
    local_650 = 1.0;
  }
  dVar8 = dVar7 * 2.519842099789747 * dVar11 * 1.2599210498948732 * local_650;
  dVar10 = sqrt(dVar8);
  dVar12 = sqrt(dVar8);
  dVar12 = dVar8 * dVar12;
  dVar6 = dVar6 * dVar6 * 2.080083823051904;
  dVar21 = dVar6 * 1.5874010519681996 * (1.0 / dVar14) * 1.5874010519681996 * local_650 * local_650;
  dVar22 = log(16.081979498692537 /
               (dVar21 * 0.123235 + dVar12 * 0.204775 + dVar10 * 3.79785 + dVar8 * 0.8969) + 1.0);
  dVar22 = (dVar8 * 0.053425 + 1.0) * 0.0621814 * dVar22;
  local_660 = local_678;
  if ((double)in_RDI[0x31] < 0.0) {
    local_660 = 0.0;
  }
  dVar23 = ((local_618 + local_660) - 2.0) * 1.9236610509315362;
  dVar24 = log(32.16395899738507 /
               (dVar21 * 0.1562925 + dVar12 * 0.420775 + dVar10 * 7.05945 + dVar8 * 1.549425) + 1.0)
  ;
  dVar10 = log(29.608749977793437 /
               (dVar21 * 0.1241775 + dVar12 * 0.1100325 + dVar10 * 5.1785 + dVar8 * 0.905775) + 1.0)
  ;
  dVar10 = (dVar8 * 0.0278125 + 1.0) * dVar10;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_668 = 0.0;
  }
  else {
    local_668 = (local_648 *
                (dVar23 * 0.0197516734986138 * dVar10 +
                dVar23 * (dVar10 * -0.0197516734986138 +
                         (dVar8 * 0.05137 + 1.0) * -0.0310907 * dVar24 + dVar22) + -dVar22)) / 2.0;
  }
  dVar5 = pdVar1[3];
  dVar8 = *in_RCX;
  dVar23 = dVar15 * 0.46914023462026644 + 1.0;
  dVar10 = pdVar1[4];
  dVar12 = pdVar1[5];
  dVar24 = dVar20 * dVar20;
  dVar25 = dVar18 * dVar18;
  dVar21 = pdVar1[6];
  dVar26 = *in_RCX * *in_RCX;
  dVar26 = dVar26 * dVar26 * dVar26;
  dVar22 = dVar13 * dVar13 * dVar13 * dVar13;
  dVar27 = 1.0 / (dVar22 * dVar22);
  dVar28 = dVar23 * dVar23;
  dVar28 = (1.0 / (dVar28 * dVar28)) / dVar28;
  dVar22 = pdVar1[7];
  dVar11 = dVar7 * 2.519842099789747 * dVar11;
  dVar7 = sqrt(dVar11);
  dVar29 = sqrt(dVar11);
  dVar6 = dVar6 * 1.5874010519681996 * (1.0 / dVar14);
  dVar14 = log(16.081979498692537 /
               (dVar6 * 0.123235 + dVar11 * dVar29 * 0.204775 + dVar7 * 3.79785 + dVar11 * 0.8969) +
               1.0);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    local_678 = 1.0;
  }
  dVar29 = log(29.608749977793437 /
               (dVar6 * 0.1241775 + dVar11 * dVar29 * 0.1100325 + dVar7 * 5.1785 + dVar11 * 0.905775
               ) + 1.0);
  dVar4 = pdVar1[9];
  dVar19 = dVar17 * 0.6 * dVar19;
  dVar6 = *in_R9 * *in_R9 * 1.2599210498948732 * 4.0 * ((1.0 / dVar9) / (dVar13 * *in_RDX));
  dVar9 = dVar19 - dVar6;
  dVar9 = dVar9 * dVar9;
  dVar19 = dVar19 + dVar6;
  dVar19 = dVar19 * dVar19;
  dVar6 = pdVar1[10];
  dVar13 = dVar9 * dVar9 * dVar9;
  dVar17 = (1.0 / (dVar19 * dVar19)) / dVar19;
  dVar7 = pdVar1[0xb];
  dVar15 = cbrt(dVar15);
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar3 * 8) =
         local_640 * 2.0 +
         local_668 * 2.0 *
         (dVar22 * dVar24 * dVar24 * (1.0 / (dVar25 * dVar25)) * 0.17058312527037534 * dVar26 *
          dVar27 * dVar28 +
         dVar21 * dVar26 * 0.17058312527037534 * dVar27 * dVar28 +
         dVar12 * dVar24 * (1.0 / dVar25) +
         dVar5 * dVar8 * 0.46914023462026644 * dVar16 * (1.0 / dVar23) +
         dVar10 * dVar20 * (1.0 / dVar18)) +
         (((dVar11 * 0.053425 + 1.0) * -0.0621814 * dVar14 +
          (local_678 + local_678 + -2.0) * 1.9236610509315362 * 0.0197516734986138 *
          (dVar11 * 0.0278125 + 1.0) * dVar29) - (local_668 + local_668)) *
         (pdVar1[0xc] * dVar9 * (1.0 / dVar19) * dVar15 +
          dVar7 * dVar13 * dVar17 * dVar15 +
          dVar4 * dVar9 * (1.0 / dVar19) + dVar6 * dVar13 * dVar17 + pdVar1[8]) +
         *(double *)(*in_stack_00000008 + lVar3 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_exc_unpol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t3, t4, t5, t6, t7, t8, t9, t10;
  double t11, t13, t14, t15, t16, t18, t19, t20;
  double t21, t22, t23, t25, t26, t28, t30, t33;
  double t34, t35, t36, t37, t40, t41, t43, t44;
  double t46, t47, t50, t53, t56, t58, t59, t62;
  double t63, t64, t66, t68, t69, t71, t72, t75;
  double t78, t82, t84, t85, t86, t87, t88, t90;
  double t91, t93, t95, t96, t100, t101, t102, t103;
  double t104, t106, t107, t108, t109, t110, t113, t114;
  double t115, t116, t117, t118, t119, t120, t123, t124;
  double t125, t126, t128, t129, t130, t131, t132, t135;
  double t136, t140, t141, t142, t143, t146, t148, t150;
  double t151, t154, t156, t157, t158, t159, t161, t163;
  double t165, t168, t169, t171, t173, t177, t178, t180;
  double t185, t188, t189, t193, t198, t201, t202, t203;
  double t212, t214, t215, t217, t218, t222, t223, t224;
  double t225, t226, t229, t230, t231, t232, t233, t236;
  double t237, t238, t239, t240, t243, t245, t247, t249;
  double t250, t253, t256, t258, t261, t262, t265, t268;
  double t270, t275, t278, t279, t284, t286, t287, t289;
  double t290, t294, t295, t296, t297, t298, t301, t302;
  double t303, t304, t305, t308, t309, t310, t311, t312;
  double t315, t316, tzk0;

  gga_xc_wb97_params *params;

  assert(p->params != NULL);
  params = (gga_xc_wb97_params * )(p->params);

  t3 = 0.1e1 <= p->zeta_threshold;
  t4 = rho[0] / 0.2e1 <= p->dens_threshold || t3;
  t5 = M_CBRT3;
  t6 = 0.1e1 / M_PI;
  t7 = POW_1_3(t6);
  t8 = t5 * t7;
  t9 = M_CBRT4;
  t10 = t9 * t9;
  t11 = M_CBRT2;
  t13 = t8 * t10 * t11;
  t14 = 0.2e1 <= p->zeta_threshold;
  t15 = POW_1_3(p->zeta_threshold);
  t16 = t15 * p->zeta_threshold;
  t18 = my_piecewise3(t14, t16, 0.2e1 * t11);
  t19 = POW_1_3(rho[0]);
  t20 = t18 * t19;
  t21 = POW_1_3(0.9e1);
  t22 = t21 * t21;
  t23 = t7 * t7;
  t25 = t22 * t23 * p->cam_omega;
  t26 = 0.1e1 / t19;
  t28 = my_piecewise3(t14, t15, t11);
  t30 = t11 / t28;
  t33 = t25 * t5 * t26 * t30 / 0.18e2;
  t34 = 0.135e1 <= t33;
  t35 = 0.135e1 < t33;
  t36 = my_piecewise3(t35, t33, 0.135e1);
  t37 = t36 * t36;
  t40 = t37 * t37;
  t41 = 0.1e1 / t40;
  t43 = t40 * t37;
  t44 = 0.1e1 / t43;
  t46 = t40 * t40;
  t47 = 0.1e1 / t46;
  t50 = 0.1e1 / t46 / t37;
  t53 = 0.1e1 / t46 / t40;
  t56 = 0.1e1 / t46 / t43;
  t58 = t46 * t46;
  t59 = 0.1e1 / t58;
  t62 = my_piecewise3(t35, 0.135e1, t33);
  t63 = sqrt(M_PI);
  t64 = 0.1e1 / t62;
  t66 = erf(t64 / 0.2e1);
  t68 = t62 * t62;
  t69 = 0.1e1 / t68;
  t71 = exp(-t69 / 0.4e1);
  t72 = t71 - 0.1e1;
  t75 = t71 - 0.3e1 / 0.2e1 - 0.2e1 * t68 * t72;
  t78 = 0.2e1 * t62 * t75 + t63 * t66;
  t82 = my_piecewise3(t34, 0.1e1 / t37 / 0.36e2 - t41 / 0.96e3 + t44 / 0.2688e5 - t47 / 0.82944e6 + t50 / 0.2838528e8 - t53 / 0.107347968e10 + t56 / 0.445906944e11 - t59 / 0.20214448128e13, 0.1e1 - 0.8e1 / 0.3e1 * t62 * t78);
  t84 = params->c_x[1];
  t85 = t84 * sigma[0];
  t86 = t11 * t11;
  t87 = rho[0] * rho[0];
  t88 = t19 * t19;
  t90 = 0.1e1 / t88 / t87;
  t91 = t86 * t90;
  t93 = sigma[0] * t86 * t90;
  t95 = 0.1e1 + 0.4e-2 * t93;
  t96 = 0.1e1 / t95;
  t100 = params->c_x[2];
  t101 = sigma[0] * sigma[0];
  t102 = t100 * t101;
  t103 = t87 * t87;
  t104 = t103 * rho[0];
  t106 = 0.1e1 / t19 / t104;
  t107 = t11 * t106;
  t108 = t95 * t95;
  t109 = 0.1e1 / t108;
  t110 = t107 * t109;
  t113 = params->c_x[3];
  t114 = t101 * sigma[0];
  t115 = t113 * t114;
  t116 = t103 * t103;
  t117 = 0.1e1 / t116;
  t118 = t108 * t95;
  t119 = 0.1e1 / t118;
  t120 = t117 * t119;
  t123 = params->c_x[4];
  t124 = t101 * t101;
  t125 = t123 * t124;
  t126 = t116 * t87;
  t128 = 0.1e1 / t88 / t126;
  t129 = t86 * t128;
  t130 = t108 * t108;
  t131 = 0.1e1 / t130;
  t132 = t129 * t131;
  t135 = params->c_x[0] + 0.4e-2 * t85 * t91 * t96 + 0.32e-4 * t102 * t110 + 0.256e-6 * t115 * t120 + 0.1024e-8 * t125 * t132;
  t136 = t82 * t135;
  t140 = my_piecewise3(t4, 0, -0.3e1 / 0.64e2 * t13 * t20 * t136);
  t141 = 0.2e1 * t140;
  t142 = my_piecewise3(t3, p->zeta_threshold, 1);
  t143 = t8 * t10;
  t146 = my_piecewise3(t3, 0.1e1 / t15, 1);
  t148 = t143 * t26 * t11 * t146;
  t150 = 0.1e1 + 0.53425e-1 * t148;
  t151 = sqrt(t148);
  t154 = POW_3_2(t148);
  t156 = t5 * t5;
  t157 = t156 * t23;
  t158 = t157 * t9;
  t159 = 0.1e1 / t88;
  t161 = t146 * t146;
  t163 = t158 * t159 * t86 * t161;
  t165 = 0.379785e1 * t151 + 0.8969e0 * t148 + 0.204775e0 * t154 + 0.123235e0 * t163;
  t168 = 0.1e1 + 0.16081824322151104822e2 / t165;
  t169 = log(t168);
  t171 = 0.62182e-1 * t150 * t169;
  t173 = my_piecewise3(0.e0 <= p->zeta_threshold, t16, 0);
  t177 = 0.1e1 / (0.2e1 * t11 - 0.2e1);
  t178 = (t18 + t173 - 0.2e1) * t177;
  t180 = 0.1e1 + 0.5137e-1 * t148;
  t185 = 0.705945e1 * t151 + 0.1549425e1 * t148 + 0.420775e0 * t154 + 0.1562925e0 * t163;
  t188 = 0.1e1 + 0.32164683177870697974e2 / t185;
  t189 = log(t188);
  t193 = 0.1e1 + 0.278125e-1 * t148;
  t198 = 0.51785e1 * t151 + 0.905775e0 * t148 + 0.1100325e0 * t154 + 0.1241775e0 * t163;
  t201 = 0.1e1 + 0.29608574643216675549e2 / t198;
  t202 = log(t201);
  t203 = t193 * t202;
  t212 = my_piecewise3(t4, 0, t142 * (-t171 + t178 * (-0.3109e-1 * t180 * t189 + t171 - 0.19751789702565206229e-1 * t203) + 0.19751789702565206229e-1 * t178 * t203) / 0.2e1);
  t214 = params->c_ss[1];
  t215 = t214 * sigma[0];
  t217 = 0.1e1 + 0.2e0 * t93;
  t218 = 0.1e1 / t217;
  t222 = params->c_ss[2];
  t223 = t222 * t101;
  t224 = t217 * t217;
  t225 = 0.1e1 / t224;
  t226 = t107 * t225;
  t229 = params->c_ss[3];
  t230 = t229 * t114;
  t231 = t224 * t217;
  t232 = 0.1e1 / t231;
  t233 = t117 * t232;
  t236 = params->c_ss[4];
  t237 = t236 * t124;
  t238 = t224 * t224;
  t239 = 0.1e1 / t238;
  t240 = t129 * t239;
  t243 = params->c_ss[0] + 0.2e0 * t215 * t91 * t218 + 0.8e-1 * t223 * t226 + 0.32e-1 * t230 * t233 + 0.64e-2 * t237 * t240;
  t245 = 0.2e1 * t212 * t243;
  t247 = t8 * t10 * t26;
  t249 = 0.1e1 + 0.53425e-1 * t247;
  t250 = sqrt(t247);
  t253 = POW_3_2(t247);
  t256 = t157 * t9 * t159;
  t258 = 0.379785e1 * t250 + 0.8969e0 * t247 + 0.204775e0 * t253 + 0.123235e0 * t256;
  t261 = 0.1e1 + 0.16081824322151104822e2 / t258;
  t262 = log(t261);
  t265 = my_piecewise3(t3, t16, 1);
  t268 = (0.2e1 * t265 - 0.2e1) * t177;
  t270 = 0.1e1 + 0.278125e-1 * t247;
  t275 = 0.51785e1 * t250 + 0.905775e0 * t247 + 0.1100325e0 * t253 + 0.1241775e0 * t256;
  t278 = 0.1e1 + 0.29608574643216675549e2 / t275;
  t279 = log(t278);
  t284 = -0.62182e-1 * t249 * t262 + 0.19751789702565206229e-1 * t268 * t270 * t279 - 0.2e1 * t212;
  t286 = params->c_ab[1];
  t287 = t286 * sigma[0];
  t289 = 0.1e1 + 0.6e-2 * t93;
  t290 = 0.1e1 / t289;
  t294 = params->c_ab[2];
  t295 = t294 * t101;
  t296 = t289 * t289;
  t297 = 0.1e1 / t296;
  t298 = t107 * t297;
  t301 = params->c_ab[3];
  t302 = t301 * t114;
  t303 = t296 * t289;
  t304 = 0.1e1 / t303;
  t305 = t117 * t304;
  t308 = params->c_ab[4];
  t309 = t308 * t124;
  t310 = t296 * t296;
  t311 = 0.1e1 / t310;
  t312 = t129 * t311;
  t315 = params->c_ab[0] + 0.6e-2 * t287 * t91 * t290 + 0.72e-4 * t295 * t298 + 0.864e-6 * t302 * t305 + 0.5184e-8 * t309 * t312;
  t316 = t284 * t315;
  tzk0 = t141 + t245 + t316;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

}